

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::ModeStatePolicy::Action
          (ModeStatePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  State *pSVar1;
  pointer pdVar2;
  int iVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  int i_1;
  int i;
  ulong uVar6;
  State *pSVar7;
  double dVar8;
  double dVar9;
  
  uVar6 = 0;
  pSVar7 = (State *)0x0;
  dVar8 = 0.0;
  while( true ) {
    ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppSVar5 - (long)ppSVar4 >> 3) <= uVar6) break;
    pSVar1 = ppSVar4[uVar6];
    iVar3 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,pSVar1);
    pdVar2 = (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pSVar1->weight + pdVar2[iVar3];
    if (dVar8 < dVar9) {
      pSVar7 = pSVar1;
    }
    pdVar2[iVar3] = dVar9;
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    uVar6 = uVar6 + 1;
    dVar8 = dVar9;
  }
  for (uVar6 = 0; uVar6 < (ulong)((long)ppSVar5 - (long)ppSVar4 >> 3); uVar6 = uVar6 + 1) {
    iVar3 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,ppSVar4[uVar6]);
    (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = 0.0;
    ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar7 != (State *)0x0) {
    iVar3 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSVar7);
    return iVar3;
  }
  __assert_fail("mode != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x8b,
                "virtual ACT_TYPE despot::ModeStatePolicy::Action(const vector<State *> &, RandomStreams &, History &) const"
               );
}

Assistant:

ACT_TYPE ModeStatePolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	double maxWeight = 0;
	State* mode = NULL;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		int id = indexer_.GetIndex(particle);
		state_probs_[id] += particle->weight;

		if (state_probs_[id] > maxWeight) {
			maxWeight = state_probs_[id];
			mode = particle;
		}
	}

	for (int i = 0; i < particles.size(); i++) {
		state_probs_[indexer_.GetIndex(particles[i])] = 0;
	}

	assert(mode != NULL);
	return policy_.GetAction(*mode);
}